

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CGameConsole::CInstance::OnInput(CInstance *this,CEvent Event)

{
  byte bVar1;
  IConsole *pIVar2;
  IInput *pIVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  undefined4 extraout_var;
  void *dest;
  char *pcVar12;
  long lVar13;
  long in_FS_OFFSET;
  byte local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [144])Event & (undefined1  [144])0x1) == (undefined1  [144])0x0)
  goto switchD_0013c38f_caseD_cc;
  if (Event.m_Key < 0xcb) {
    if (Event.m_Key == 9) {
      pIVar3 = ((this->m_pGameConsole->super_CComponent).m_pClient)->m_pInput;
      iVar6 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,0x161);
      uVar8 = 1;
      if ((char)iVar6 == '\0') {
        pIVar3 = ((this->m_pGameConsole->super_CComponent).m_pClient)->m_pInput;
        uVar8 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,0x165);
      }
      uVar7 = -(uVar8 & 0xff) | 1;
      if ((this->m_Type == 0) ||
         (iVar6 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->
                    super_IInterface)._vptr_IInterface[0x1a])(), (char)iVar6 != '\0')) {
        if ((this->m_Type == 1) &&
           (iVar6 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->
                      super_IInterface)._vptr_IInterface[0x1a])(), (char)iVar6 != '\0')) {
          uVar9 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->
                    super_IInterface)._vptr_IInterface[0x1b])();
        }
        else {
          uVar9 = 0;
        }
        pIVar2 = this->m_pGameConsole->m_pConsole;
        iVar6 = (*(pIVar2->super_IInterface)._vptr_IInterface[5])
                          (pIVar2,this->m_aCompletionBuffer,(ulong)(uint)this->m_CompletionFlagmask,
                           (ulong)(uVar9 & 0xff),IConsole::EmptyPossibleCommandCallback,0);
        if (iVar6 == 0) {
          if (this->m_CompletionChosen != -1) {
            this->m_CompletionChosen = -1;
            this->m_CompletionRenderOffset = 0.0;
            this->m_CompletionRenderOffsetChange = 0.0;
          }
        }
        else {
          if ((char)uVar8 == '\x01' && this->m_CompletionChosen == -1) {
            this->m_CompletionChosen = 0;
          }
          this->m_CompletionChosen = (int)(iVar6 + uVar7 + this->m_CompletionChosen) % iVar6;
          pIVar2 = this->m_pGameConsole->m_pConsole;
          (*(pIVar2->super_IInterface)._vptr_IInterface[5])
                    (pIVar2,this->m_aCompletionBuffer,(ulong)(uint)this->m_CompletionFlagmask,
                     (ulong)(uVar9 & 0xff),PossibleCommandsCompleteCallback,this);
        }
      }
      if ((this->m_Type == 1) &&
         (iVar6 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->
                    super_IInterface)._vptr_IInterface[0x1a])(), (char)iVar6 != '\0')) {
        pcVar12 = (this->m_Input).m_pStr;
        pcVar10 = str_startswith_nocase(pcVar12,"sv_map ");
        if (pcVar10 == (char *)0x0) {
          bVar5 = true;
          do {
            bVar4 = bVar5;
            if (!bVar4) goto switchD_0013c38f_caseD_cc;
            pcVar10 = str_startswith_nocase(pcVar12,"change_map ");
            bVar5 = false;
          } while (pcVar10 == (char *)0x0);
          if (!bVar4) goto switchD_0013c38f_caseD_cc;
        }
        pIVar2 = this->m_pGameConsole->m_pConsole;
        iVar6 = (*(pIVar2->super_IInterface)._vptr_IInterface[6])
                          (pIVar2,this->m_aCompletionMapBuffer,
                           IConsole::EmptyPossibleCommandCallback,0);
        if (iVar6 == 0) {
          if (this->m_CompletionMapChosen != -1) {
            this->m_CompletionMapChosen = -1;
            this->m_CompletionRenderOffset = 0.0;
            this->m_CompletionRenderOffsetChange = 0.0;
          }
        }
        else {
          if ((char)uVar8 == '\x01' && this->m_CompletionMapChosen == -1) {
            this->m_CompletionMapChosen = 0;
          }
          this->m_CompletionMapChosen = (int)(iVar6 + uVar7 + this->m_CompletionMapChosen) % iVar6;
          pIVar2 = this->m_pGameConsole->m_pConsole;
          (*(pIVar2->super_IInterface)._vptr_IInterface[6])
                    (pIVar2,this->m_aCompletionMapBuffer,PossibleMapsCompleteCallback,this);
        }
      }
    }
    else if (Event.m_Key == 0xd) goto LAB_0013c44e;
    goto switchD_0013c38f_caseD_cc;
  }
  switch(Event.m_Key) {
  case 0xcb:
    this->m_BacklogActPage = this->m_BacklogActPage + 1;
    break;
  case 0xcc:
  case 0xcd:
  case 0xcf:
  case 0xd0:
    break;
  case 0xce:
    iVar6 = 0;
    if (0 < this->m_BacklogActPage) {
      iVar6 = this->m_BacklogActPage + -1;
    }
    this->m_BacklogActPage = iVar6;
    break;
  case 0xd1:
    if (this->m_pHistoryEntry != (char *)0x0) {
      pcVar12 = (char *)CRingBufferBase::Next
                                  (&(this->m_History).super_CRingBufferBase,this->m_pHistoryEntry);
      this->m_pHistoryEntry = pcVar12;
    }
    pcVar12 = this->m_pHistoryEntry;
    if (pcVar12 == (char *)0x0) {
      CLineInput::Clear(&this->m_Input);
      goto LAB_0013c230;
    }
    goto LAB_0013c6e1;
  case 0xd2:
    if (this->m_pHistoryEntry == (char *)0x0) {
      pcVar12 = (char *)CRingBufferBase::Last(&(this->m_History).super_CRingBufferBase);
LAB_0013c6c3:
      this->m_pHistoryEntry = pcVar12;
    }
    else {
      pcVar12 = (char *)CRingBufferBase::Prev
                                  (&(this->m_History).super_CRingBufferBase,this->m_pHistoryEntry);
      if (pcVar12 != (char *)0x0) goto LAB_0013c6c3;
    }
    pcVar12 = this->m_pHistoryEntry;
    if (pcVar12 == (char *)0x0) goto LAB_0013c230;
LAB_0013c6e1:
    CLineInput::Set(&this->m_Input,pcVar12);
    goto LAB_0013c230;
  default:
    if (Event.m_Key == 0xd8) {
LAB_0013c44e:
      if (*(this->m_Input).m_pStr != '\0') {
        if ((this->m_Type == 0) ||
           (iVar6 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->
                      super_IInterface)._vptr_IInterface[0x1a])(), (char)iVar6 != '\0')) {
          dest = CRingBufferBase::Allocate
                           (&(this->m_History).super_CRingBufferBase,(this->m_Input).m_Len + 1);
          mem_copy(dest,(this->m_Input).m_pStr,(this->m_Input).m_Len + 1);
        }
        ExecuteLine(this,(this->m_Input).m_pStr);
        CLineInput::Clear(&this->m_Input);
        this->m_pHistoryEntry = (char *)0x0;
      }
      goto LAB_0013c230;
    }
  }
switchD_0013c38f_caseD_cc:
  CLineInput::ProcessInput(&this->m_Input,&Event);
LAB_0013c230:
  if ((Event.m_Flags & 9U) != 0) {
    if (((Event.m_Key != 9) && (Event.m_Key != 0x161)) && (Event.m_Key != 0x165)) {
      this->m_CompletionChosen = -1;
      str_copy(this->m_aCompletionBuffer,(this->m_Input).m_pStr,0x80);
      lVar13 = 0;
      do {
        pcVar12 = *(char **)((long)s_apMapCommands + lVar13);
        pcVar10 = str_startswith_nocase((this->m_Input).m_pStr,pcVar12);
        if (pcVar10 != (char *)0x0) {
          this->m_CompletionMapChosen = -1;
          pcVar10 = (this->m_Input).m_pStr;
          iVar6 = str_length(pcVar12);
          str_copy(this->m_aCompletionMapBuffer,pcVar10 + iVar6,0x80);
        }
        lVar13 = lVar13 + 8;
      } while (lVar13 == 8);
      this->m_CompletionRenderOffset = 0.0;
      this->m_CompletionRenderOffsetChange = 0.0;
    }
    pcVar12 = (this->m_Input).m_pStr;
    uVar11 = 0;
    do {
      bVar1 = pcVar12[uVar11];
      if ((bVar1 & 0xdf) == 0) goto LAB_0013c30d;
      local_68[uVar11] = bVar1;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x2f);
    uVar11 = 0x2f;
LAB_0013c30d:
    local_68[uVar11 & 0xffffffff] = 0;
    pIVar2 = this->m_pGameConsole->m_pConsole;
    uVar8 = this->m_CompletionFlagmask;
    if ((this->m_Type == 1) &&
       (iVar6 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->super_IInterface
                  )._vptr_IInterface[0x1a])(), (char)iVar6 != '\0')) {
      uVar7 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                _vptr_IInterface[0x1b])();
    }
    else {
      uVar7 = 0;
    }
    iVar6 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])
                      (pIVar2,local_68,(ulong)uVar8,(ulong)(uVar7 & 0xff));
    lVar13 = CONCAT44(extraout_var,iVar6);
    if (lVar13 == 0) {
      this->m_IsCommand = false;
    }
    else {
      this->m_IsCommand = true;
      str_copy(this->m_aCommandName,*(char **)(lVar13 + 0x10),0x30);
      str_copy(this->m_aCommandHelp,*(char **)(lVar13 + 0x18),0x80);
      str_copy(this->m_aCommandParams,*(char **)(lVar13 + 0x20),0x60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameConsole::CInstance::OnInput(IInput::CEvent Event)
{
	bool Handled = false;

	if(Event.m_Flags&IInput::FLAG_PRESS)
	{
		if(Event.m_Key == KEY_RETURN || Event.m_Key == KEY_KP_ENTER)
		{
			if(m_Input.GetString()[0])
			{
				if(m_Type == CONSOLETYPE_LOCAL || m_pGameConsole->Client()->RconAuthed())
				{
					char *pEntry = m_History.Allocate(m_Input.GetLength()+1);
					mem_copy(pEntry, m_Input.GetString(), m_Input.GetLength()+1);
				}
				ExecuteLine(m_Input.GetString());
				m_Input.Clear();
				m_pHistoryEntry = 0x0;
			}

			Handled = true;
		}
		else if(Event.m_Key == KEY_UP)
		{
			if(m_pHistoryEntry)
			{
				char *pTest = m_History.Prev(m_pHistoryEntry);

				if(pTest)
					m_pHistoryEntry = pTest;
			}
			else
				m_pHistoryEntry = m_History.Last();

			if(m_pHistoryEntry)
				m_Input.Set(m_pHistoryEntry);
			Handled = true;
		}
		else if(Event.m_Key == KEY_DOWN)
		{
			if(m_pHistoryEntry)
				m_pHistoryEntry = m_History.Next(m_pHistoryEntry);

			if(m_pHistoryEntry)
				m_Input.Set(m_pHistoryEntry);
			else
				m_Input.Clear();
			Handled = true;
		}
		else if(Event.m_Key == KEY_TAB)
		{
			const int Direction = m_pGameConsole->m_pClient->Input()->KeyIsPressed(KEY_LSHIFT) || m_pGameConsole->m_pClient->Input()->KeyIsPressed(KEY_RSHIFT) ? -1 : 1;

			// command completion
			if(m_Type == CGameConsole::CONSOLETYPE_LOCAL || m_pGameConsole->Client()->RconAuthed())
			{
				const bool UseTempCommands = m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && m_pGameConsole->Client()->UseTempRconCommands();
				const int CompletionEnumerationCount = m_pGameConsole->m_pConsole->PossibleCommands(m_aCompletionBuffer, m_CompletionFlagmask, UseTempCommands);
				if(CompletionEnumerationCount)
				{
					if(m_CompletionChosen == -1 && Direction < 0)
						m_CompletionChosen = 0;
					m_CompletionChosen = (m_CompletionChosen + Direction + CompletionEnumerationCount) % CompletionEnumerationCount;
					m_pGameConsole->m_pConsole->PossibleCommands(m_aCompletionBuffer, m_CompletionFlagmask, UseTempCommands, PossibleCommandsCompleteCallback, this);
				}
				else if(m_CompletionChosen != -1)
				{
					m_CompletionChosen = -1;
					Reset();
				}
			}

			// maplist completion
			if(m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && IsMapCommandPrefix(GetString()))
			{
				const int CompletionMapEnumerationCount = m_pGameConsole->m_pConsole->PossibleMaps(m_aCompletionMapBuffer);
				if(CompletionMapEnumerationCount)
				{
					if(m_CompletionMapChosen == -1 && Direction < 0)
						m_CompletionMapChosen = 0;
					m_CompletionMapChosen = (m_CompletionMapChosen + Direction + CompletionMapEnumerationCount) % CompletionMapEnumerationCount;
					m_pGameConsole->m_pConsole->PossibleMaps(m_aCompletionMapBuffer, PossibleMapsCompleteCallback, this);
				}
				else if(m_CompletionMapChosen != -1)
				{
					m_CompletionMapChosen = -1;
					Reset();
				}
			}
		}
		else if(Event.m_Key == KEY_PAGEUP)
		{
			++m_BacklogActPage;
		}
		else if(Event.m_Key == KEY_PAGEDOWN)
		{
			--m_BacklogActPage;
			if(m_BacklogActPage < 0)
				m_BacklogActPage = 0;
		}
	}

	if(!Handled)
		m_Input.ProcessInput(Event);

	if(Event.m_Flags&(IInput::FLAG_PRESS|IInput::FLAG_TEXT))
	{
		if(Event.m_Key != KEY_TAB && Event.m_Key != KEY_LSHIFT && Event.m_Key != KEY_RSHIFT)
		{
			m_CompletionChosen = -1;
			str_copy(m_aCompletionBuffer, m_Input.GetString(), sizeof(m_aCompletionBuffer));

			for(unsigned i = 0; i < sizeof(s_apMapCommands) / sizeof(char *); i++)
			{
				if(str_startswith_nocase(GetString(), s_apMapCommands[i]))
				{
					m_CompletionMapChosen = -1;
					str_copy(m_aCompletionMapBuffer, &m_Input.GetString()[str_length(s_apMapCommands[i])], sizeof(m_aCompletionBuffer));
				}
			}
			
			Reset();
		}

		// find the current command
		{
			char aBuf[sizeof(m_aCommandName)];
			const char *pSrc = GetString();
			int i = 0;
			for(; i < (int)sizeof(aBuf)-1 && *pSrc && *pSrc != ' '; i++, pSrc++)
				aBuf[i] = *pSrc;
			aBuf[i] = 0;

			const IConsole::CCommandInfo *pCommand = m_pGameConsole->m_pConsole->GetCommandInfo(aBuf, m_CompletionFlagmask,
				m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && m_pGameConsole->Client()->UseTempRconCommands());
			if(pCommand)
			{
				m_IsCommand = true;
				str_copy(m_aCommandName, pCommand->m_pName, sizeof(m_aCommandName));
				str_copy(m_aCommandHelp, pCommand->m_pHelp, sizeof(m_aCommandHelp));
				str_copy(m_aCommandParams, pCommand->m_pParams, sizeof(m_aCommandParams));
			}
			else
				m_IsCommand = false;
		}
	}
}